

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avltree.cc
# Opt level: O3

avl_node * avl_insert(avl_tree *tree,avl_node *node,avl_cmp_func *func)

{
  avl_node *paVar1;
  uint uVar2;
  int iVar3;
  avl_node *paVar4;
  avl_node *paVar5;
  uint uVar6;
  long lVar7;
  avl_node *paVar8;
  uint uVar9;
  avl_tree *paVar10;
  
  paVar5 = tree->root;
  if (tree->root == (avl_node *)0x0) {
    node->parent = (avl_node *)0x1;
    node->left = (avl_node *)0x0;
    node->right = (avl_node *)0x0;
    paVar10 = tree;
  }
  else {
    do {
      paVar8 = paVar5;
      iVar3 = (*func)(paVar8,node,tree->aux);
      lVar7 = 8;
      if ((iVar3 < 1) && (lVar7 = 0x10, -1 < iVar3)) {
        return paVar8;
      }
      paVar5 = *(avl_node **)((long)&paVar8->parent + lVar7);
    } while (paVar5 != (avl_node *)0x0);
    node->parent = (avl_node *)(((ulong)paVar8 & 0xfffffffffffffffc) + 1);
    node->left = (avl_node *)0x0;
    node->right = (avl_node *)0x0;
    iVar3 = (*func)(paVar8,node,tree->aux);
    if (iVar3 < 1) {
      paVar10 = (avl_tree *)&paVar8->right;
    }
    else {
      paVar10 = (avl_tree *)&paVar8->left;
    }
  }
  paVar10->root = node;
  iVar3 = 0;
  do {
    if (node == (avl_node *)0x0) {
      return (avl_node *)0x0;
    }
    paVar5 = node->parent;
    paVar8 = (avl_node *)((ulong)paVar5 & 0xfffffffffffffffc);
    if (paVar8 == (avl_node *)0x0) {
      paVar4 = node;
      if (node == tree->root) {
        paVar5 = _balance_tree(tree->root,iVar3);
        tree->root = paVar5;
        return node;
      }
    }
    else {
      paVar1 = paVar8->right;
      paVar4 = _balance_tree(node,iVar3);
      (&paVar8->left)[paVar1 == node] = paVar4;
      if ((paVar4->left != (avl_node *)0x0) || (paVar4->right != (avl_node *)0x0)) {
        uVar9 = ((uint)paVar5 & 3) - 1;
        uVar2 = -uVar9;
        if (0 < (int)uVar9) {
          uVar2 = uVar9;
        }
        uVar6 = (*(uint *)&paVar4->parent & 3) - 1;
        uVar9 = -uVar6;
        if (0 < (int)uVar6) {
          uVar9 = uVar6;
        }
        if (uVar9 <= uVar2) {
          return paVar4;
        }
      }
      iVar3 = (uint)(paVar8->left != paVar4) * 2 + -1;
    }
    node = paVar8;
    if (iVar3 == 0) {
      return paVar4;
    }
  } while( true );
}

Assistant:

struct avl_node* avl_insert(struct avl_tree *tree,
                            struct avl_node *node,
                            avl_cmp_func *func)
{
    __AVL_DEBUG_INSERT(node);

    struct avl_node *p=NULL,*cur;
    int cmp, bf, bf_old;

    cur = tree->root;
    while(cur)
    {
        cmp = func(cur, node, tree->aux);
        p = cur;

        if(cmp > 0) {
            cur = cur->left;
        }else if (cmp < 0){
            cur = cur->right;
        }else {
            // duplicated key -> return
            return cur;
        }
    }

    avl_set_parent(node, p);
    avl_set_bf(node, 0);
    node->left = node->right = NULL;
#ifdef _AVL_NEXT_POINTER
    node->prev = node->next = NULL;
#endif

    // P is parent node of CUR
    if(p) {
        if(func(p, node, tree->aux) > 0) {
            p->left = node;
#ifdef _AVL_NEXT_POINTER
            node->next = p;
            node->prev = p->prev;
            if (p->prev) p->prev->next = node;
            p->prev = node;
#endif

        }else {
            p->right = node;
#ifdef _AVL_NEXT_POINTER
            node->prev = p;
            node->next = p->next;
            if (p->next) p->next->prev = node;
            p->next = node;
#endif
        }

    } else {
        // no parent .. make NODE as root
        tree->root = node;
    }

    // recursive balancing process .. scan from leaf to root
    bf = 0;
    while(node) {
        p = avl_parent(node);

        if (p) {
            // if parent exists
            bf_old = avl_bf(node);

            if (p->right == node) {
                node = _balance_tree(node, bf);
                p->right = node;
            }else {
                node = _balance_tree(node, bf);
                p->left = node;
            }

            // calculate balance facter BF for parent
            if (node->left == NULL && node->right == NULL) {
                // leaf node
                if (p->left == node) bf = -1;
                else bf = 1;
            } else {
                // index ndoe
                bf = 0;
                if (_abs(bf_old) < _abs(avl_bf(node))) {
                    // if ABS of balance factor increases
                    // cascade to parent
                    if (p->left == node) bf = -1;
                    else bf = 1;
                }
            }

        } else if(node == tree->root){
            tree->root = _balance_tree(tree->root, bf);
            break;
        }
        if (bf == 0) break;

        node = p;
    }

    __AVL_DEBUG_DISPLAY(tree);

    return node;
}